

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O2

ANNdist annDist(int dim,ANNpoint p,ANNpoint q)

{
  ulong uVar1;
  ulong uVar2;
  ANNdist AVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)dim;
  if (dim < 1) {
    uVar2 = uVar1;
  }
  AVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    AVar3 = AVar3 + (p[uVar1] - q[uVar1]) * (p[uVar1] - q[uVar1]);
  }
  return AVar3;
}

Assistant:

ANNdist annDist(  // interpoint squared distance
    int dim, ANNpoint p, ANNpoint q) {
    register int d;
    register ANNcoord diff;
    register ANNcoord dist;

    dist = 0;
    for (d = 0; d < dim; d++) {
        diff = p[d] - q[d];
        dist = ANN_SUM(dist, ANN_POW(diff));
    }
    return dist;
}